

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenRefCount.hpp
# Opt level: O3

TokenRefCount<antlr::Token> * __thiscall
antlr::TokenRefCount<antlr::Token>::operator=
          (TokenRefCount<antlr::Token> *this,TokenRefCount<antlr::Token> *other)

{
  uint *puVar1;
  TokenRef *pTVar2;
  TokenRef *this_00;
  
  pTVar2 = other->ref;
  this_00 = this->ref;
  if (pTVar2 != this_00) {
    if (pTVar2 != (TokenRef *)0x0) {
      pTVar2->count = pTVar2->count + 1;
    }
    if (this_00 != (TokenRef *)0x0) {
      puVar1 = &this_00->count;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        TokenRef::~TokenRef(this_00);
        operator_delete(this_00,0x10);
      }
    }
    this->ref = pTVar2;
  }
  return this;
}

Assistant:

TokenRefCount<T>& operator=(const TokenRefCount<T>& other)
	{
		if( other.ref != ref )
		{
			TokenRef* tmp = other.ref ? other.ref->increment() : 0;

			if (ref && ref->decrement())
				delete ref;

			ref=tmp;
		}
		return *this;
	}